

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::GlobalUseScanner::readsGlobalOnlyToWriteIt(wasm::Expression*,wasm::
Expression*)::FlowScanner::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  Expression *ast;
  bool bVar1;
  GlobalGet *pGVar2;
  Expression **ppEVar3;
  size_t sVar4;
  string_view sVar5;
  bool local_1f9;
  string_view local_1d0;
  If *local_1c0;
  If *iff;
  undefined1 local_1a8 [8];
  EffectAnalyzer parentEffects;
  Expression *child;
  Expression *parent;
  int i;
  GlobalGet *get;
  Expression *curr_local;
  FlowScanner *this_local;
  
  pGVar2 = Expression::dynCast<wasm::GlobalGet>(curr);
  if ((pGVar2 != (GlobalGet *)0x0) &&
     (bVar1 = IString::operator==(&(pGVar2->name).super_IString,(IString *)((long)this + 0x150)),
     bVar1)) {
    ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::back
                        ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
    if ((GlobalGet *)*ppEVar3 != pGVar2) {
      __assert_fail("expressionStack.back() == get",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SimplifyGlobals.cpp"
                    ,0xd9,
                    "void wasm::(anonymous namespace)::GlobalUseScanner::readsGlobalOnlyToWriteIt(Expression *, Expression *)::FlowScanner::visitExpression(Expression *)"
                   );
    }
    sVar4 = SmallVector<wasm::Expression_*,_10UL>::size
                      ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
    for (parent._4_4_ = (int)sVar4 + -2; -1 < parent._4_4_; parent._4_4_ = parent._4_4_ + -1) {
      ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                          ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8),
                           (long)parent._4_4_);
      ast = *ppEVar3;
      ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                          ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8),
                           (long)(parent._4_4_ + 1));
      parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)*ppEVar3;
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_1a8,*(PassOptions **)((long)this + 0x160),
                 *(Module **)((long)this + 0x168));
      EffectAnalyzer::visit((EffectAnalyzer *)local_1a8,ast);
      bVar1 = EffectAnalyzer::hasUnremovableSideEffects((EffectAnalyzer *)local_1a8);
      if (bVar1) {
        *(undefined1 *)((long)this + 0x170) = 0;
        iff._0_4_ = 2;
      }
      else {
        local_1c0 = Expression::dynCast<wasm::If>(ast);
        if ((local_1c0 == (If *)0x0) ||
           (local_1c0->condition !=
            (Expression *)
            parentEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
          iff._0_4_ = 0;
        }
        else {
          local_1f9 = false;
          if (local_1c0->ifFalse == (Expression *)0x0) {
            sVar5 = (string_view)
                    anon_unknown_224::GlobalUseScanner::readsGlobalOnlyToWriteIt
                              (*(GlobalUseScanner **)((long)this + 0x148),local_1c0->condition,
                               local_1c0->ifTrue);
            local_1d0 = sVar5;
            local_1f9 = IString::operator==((IString *)&local_1d0,(IString *)((long)this + 0x150));
          }
          if (local_1f9 == false) {
            *(undefined1 *)((long)this + 0x170) = 0;
            iff._0_4_ = 2;
          }
          else {
            iff._0_4_ = 2;
          }
        }
      }
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1a8);
      if ((int)iff != 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
        if (auto* get = curr->dynCast<GlobalGet>()) {
          if (get->name == writtenGlobal) {
            // We found the get of the global. Check where its value flows to,
            // and how it is used there.
            assert(expressionStack.back() == get);
            for (int i = int(expressionStack.size()) - 2; i >= 0; i--) {
              // Consider one pair of parent->child, and check if the parent
              // causes any problems when the child's value reaches it.
              auto* parent = expressionStack[i];
              auto* child = expressionStack[i + 1];
              EffectAnalyzer parentEffects(passOptions, wasm);
              parentEffects.visit(parent);
              if (parentEffects.hasUnremovableSideEffects()) {
                // The parent has some side effect, and the child's value may
                // be used to determine its manner, so this is dangerous.
                ok = false;
                break;
              }

              if (auto* iff = parent->dynCast<If>()) {
                if (iff->condition == child) {
                  // The child is used to decide what code to run, which is
                  // dangerous: check what effects it causes. If it is a nested
                  // appearance of the pattern, that is one case that we know is
                  // actually safe.
                  if (!iff->ifFalse &&
                      globalUseScanner.readsGlobalOnlyToWriteIt(
                        iff->condition, iff->ifTrue) == writtenGlobal) {
                    // This is safe, and we can stop here: the value does not
                    // flow any further.
                    break;
                  }

                  // Otherwise, we found a problem, and can stop.
                  ok = false;
                  break;
                }
              }
            }
          }
        }
      }